

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O2

optional<Vault::HttpResponse> * __thiscall
Vault::HttpClient::executeRequest
          (optional<Vault::HttpResponse> *__return_storage_ptr__,HttpClient *this,Url *url,
          Token *token,Namespace *ns,CurlSetupCallback *setupCallback,
          CurlHeaderCallback *curlHeaderCallback,HttpErrorCallback *errorCallback)

{
  path *__p;
  undefined8 uVar1;
  CurlWrapper curlWrapper;
  path local_78;
  undefined8 local_50 [4];
  
  CurlWrapper::CurlWrapper(&curlWrapper,errorCallback);
  if ((token->value_)._M_string_length != 0) {
    Vault::operator+(&local_78._M_pathname,"X-Vault-Token: ",token);
    curlWrapper.slist_ =
         (curl_slist *)curl_slist_append(curlWrapper.slist_,local_78._M_pathname._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((ns->value_)._M_string_length != 0) {
    Vault::operator+(&local_78._M_pathname,"X-Vault-Namespace: ",ns);
    curlWrapper.slist_ =
         (curl_slist *)curl_slist_append(curlWrapper.slist_,local_78._M_pathname._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Content-Type: application/json",(allocator<char> *)local_50);
  curlWrapper.slist_ =
       (curl_slist *)curl_slist_append(curlWrapper.slist_,local_78._M_pathname._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_78);
  curlWrapper.slist_ =
       std::function<curl_slist_*(curl_slist_*)>::operator()(curlHeaderCallback,curlWrapper.slist_);
  if ((this->config_).verify_ == true) {
    __p = &(this->config_).caBundle_;
    std::filesystem::__cxx11::path::path(&local_78,__p);
    std::filesystem::__cxx11::path::~path(&local_78);
    if (local_78._M_pathname._M_string_length != 0) {
      std::filesystem::__cxx11::path::path(&local_78,__p);
      std::__cxx11::string::string((string *)local_50,(string *)&local_78);
      curl_easy_setopt(curlWrapper.curl_,0x2751,local_50[0]);
      std::__cxx11::string::~string((string *)local_50);
      std::filesystem::__cxx11::path::~path(&local_78);
    }
    uVar1 = 1;
    curl_easy_setopt(curlWrapper.curl_,0x40,1);
  }
  else {
    uVar1 = 0;
    curl_easy_setopt(curlWrapper.curl_,0x40,0);
  }
  curl_easy_setopt(curlWrapper.curl_,0x51,uVar1);
  curl_easy_setopt(curlWrapper.curl_,0x4e,(this->config_).connectTimeout_.value_);
  curl_easy_setopt(curlWrapper.curl_,0xd,(this->config_).requestTimeout_.value_);
  curl_easy_setopt(curlWrapper.curl_,0x14,(this->config_).lowSpeedTimeout_.value_);
  curl_easy_setopt(curlWrapper.curl_,0x13,(this->config_).lowSpeedLimit_.value_);
  curl_easy_setopt(curlWrapper.curl_,0x2712,(url->value_)._M_dataplus._M_p);
  if ((this->config_).debug_ == true) {
    curl_easy_setopt(curlWrapper.curl_,0x29,1);
  }
  std::function<void_(void_*)>::operator()(setupCallback,curlWrapper.curl_);
  CurlWrapper::execute(__return_storage_ptr__,&curlWrapper);
  CurlWrapper::~CurlWrapper(&curlWrapper);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::HttpResponse> Vault::HttpClient::executeRequest(
    const Vault::Url &url, const Vault::Token &token,
    const Vault::Namespace &ns, const Vault::CurlSetupCallback &setupCallback,
    const Vault::CurlHeaderCallback &curlHeaderCallback,
    const Vault::HttpErrorCallback &errorCallback) const {
  CurlWrapper curlWrapper{errorCallback};

  if (!token.empty()) {
    curlWrapper.appendHeader("X-Vault-Token: " + token);
  }

  if (!ns.empty()) {
    curlWrapper.appendHeader("X-Vault-Namespace: " + ns);
  }

  curlWrapper.appendHeader("Content-Type: application/json");
  curlWrapper.setupHeaders(curlHeaderCallback);

  if (config_.getVerify()) {
    if (!config_.getCaBundle().empty()) {
      curlWrapper.setOption(CURLOPT_CAINFO,
                            config_.getCaBundle().u8string().c_str());
    }

    curlWrapper.setOption(CURLOPT_SSL_VERIFYPEER, 1L);
    curlWrapper.setOption(CURLOPT_SSL_VERIFYHOST, 1L);
  } else {
    curlWrapper.setOption(CURLOPT_SSL_VERIFYPEER, 0L);
    curlWrapper.setOption(CURLOPT_SSL_VERIFYHOST, 0L);
  }

  curlWrapper.setOption(CURLOPT_CONNECTTIMEOUT,
                        config_.getConnectTimeout().value());
  curlWrapper.setOption(CURLOPT_TIMEOUT, config_.getRequestTimeout().value());
  curlWrapper.setOption(CURLOPT_LOW_SPEED_TIME,
                        config_.getLowSpeedTimeout().value());
  curlWrapper.setOption(CURLOPT_LOW_SPEED_LIMIT,
                        config_.getLowSpeedLimit().value());
  curlWrapper.setOption(CURLOPT_URL, url.value().c_str());

  if (config_.getDebug()) {
    curlWrapper.setOption(CURLOPT_VERBOSE, 1L);
  }

  curlWrapper.setupOptions(setupCallback);

  return curlWrapper.execute();
}